

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

int tc_uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,tc_uECC_Curve curve)

{
  char cVar1;
  cmpresult_t cVar2;
  tc_uECC_word_t tVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  tc_uECC_word_t local_88 [2];
  tc_uECC_word_t _public [16];
  tc_uECC_word_t _private [8];
  
  iVar12 = (int)curve->num_n_bits;
  iVar6 = iVar12 + 0xe;
  if (-1 < iVar12 + 7) {
    iVar6 = iVar12 + 7;
  }
  tc_uECC_vli_bytesToNative(_public + 0xe,private_key,iVar6 >> 3);
  iVar6 = iVar12 + 0x3e;
  if (-1 < iVar12 + 0x1f) {
    iVar6 = iVar12 + 0x1f;
  }
  cVar11 = (char)(iVar6 >> 5);
  if (cVar11 < '\x01') {
    iVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 | _public[uVar5 + 0xe];
      uVar5 = uVar5 + 1;
    } while ((iVar6 >> 5 & 0x7f) != uVar5);
    iVar6 = 0;
    if (((uVar7 != 0) &&
        (cVar2 = tc_uECC_vli_cmp(curve->n,_public + 0xe,cVar11), iVar6 = 0, cVar2 == '\x01')) &&
       (tVar3 = EccPoint_compute_public_key(local_88,_public + 0xe,curve), tVar3 != 0)) {
      uVar7 = (uint)curve->num_bytes;
      iVar6 = 1;
      if ('\0' < curve->num_bytes) {
        lVar8 = (long)(int)uVar7;
        iVar12 = uVar7 * 8;
        lVar9 = 0;
        do {
          iVar12 = iVar12 + -8;
          uVar7 = uVar7 - 1;
          bVar4 = (byte)iVar12 & 0x18;
          public_key[lVar9] =
               (uint8_t)(*(uint *)((long)local_88 + (ulong)(uVar7 & 0xfffffffc)) >> bVar4);
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
        cVar11 = curve->num_bytes;
        if (0 < (long)cVar11) {
          cVar1 = curve->num_words;
          uVar7 = (uint)cVar11;
          uVar5 = (ulong)(int)uVar7;
          iVar12 = uVar7 * 8;
          uVar10 = (ulong)(0 >> bVar4);
          do {
            uVar7 = uVar7 - 1;
            iVar12 = iVar12 + -8;
            public_key[uVar10 + (long)cVar11] =
                 (uint8_t)(*(uint *)((long)_public +
                                    (ulong)(uVar7 & 0xfffffffc) + (long)cVar1 * 4 + -8) >>
                          ((byte)iVar12 & 0x18));
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int tc_uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key,
			    tc_uECC_Curve curve)
{

	tc_uECC_word_t _private[NUM_ECC_WORDS];
	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(
	_private,
	private_key,
	BITS_TO_BYTES(curve->num_n_bits));

	/* Make sure the private key is in the range [1, n-1]. */
	if (tc_uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
		return 0;
	}

	if (tc_uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
		return 0;
	}

	/* Compute public key. */
	if (!EccPoint_compute_public_key(_public, _private, curve)) {
		return 0;
	}

	tc_uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
	tc_uECC_vli_nativeToBytes(
	public_key +
	curve->num_bytes, curve->num_bytes, _public + curve->num_words);
	return 1;
}